

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.h
# Opt level: O1

void __thiscall
google::protobuf::io::Printer::
PrintInternal<char[11],std::__cxx11::string,char[13],std::__cxx11::string>
          (Printer *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *vars,char *text,char *key,string *value,char (*args) [11],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
          char (*args_2) [13],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3)

{
  mapped_type *pmVar1;
  allocator local_51;
  key_type local_50;
  
  std::__cxx11::string::string((string *)&local_50,key,&local_51);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](vars,&local_50);
  std::__cxx11::string::_M_assign((string *)pmVar1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  PrintInternal<char[13],std::__cxx11::string>(this,vars,text,*args,args_1,args_2,args_3);
  return;
}

Assistant:

void PrintInternal(std::map<std::string, std::string>* vars, const char* text,
                     const char* key, const std::string& value,
                     const Args&... args) {
    (*vars)[key] = value;
    PrintInternal(vars, text, args...);
  }